

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryType::SerializeWithCachedSizes
          (DictionaryType *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DictionaryType *this_local;
  
  bVar1 = has_keytype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->keytype_->super_MessageLite,output);
  }
  bVar1 = has_valuetype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->valuetype_->super_MessageLite,output);
  }
  return;
}

Assistant:

void DictionaryType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.DictionaryType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.ValueType keyType = 1;
  if (this->has_keytype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->keytype_, output);
  }

  // .CoreML.Specification.MILSpec.ValueType valueType = 2;
  if (this->has_valuetype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->valuetype_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.DictionaryType)
}